

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void readData(string *filename,long *dataNumber,mydataFmt **pTeam,int length)

{
  mydataFmt *pmVar1;
  int iVar2;
  ostream *poVar3;
  istream *piVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  string line;
  ifstream in;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&in,(filename->_M_dataplus)._M_p,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) == 0) {
    lVar6 = *dataNumber;
    lVar5 = 0;
    iVar9 = 0;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&in,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      cVar7 = (char)&line;
      if (lVar5 < lVar6) {
        std::__cxx11::string::erase((ulong)&line,0);
        iVar2 = std::__cxx11::string::find(cVar7,0x5d);
        std::__cxx11::string::erase((ulong)&line,(long)iVar2);
        iVar2 = std::__cxx11::string::find(cVar7,0xd);
        if (iVar2 != -1) {
          std::__cxx11::string::erase((ulong)&line,(long)iVar2);
        }
        lVar8 = (long)iVar9;
      }
      else {
        iVar9 = iVar9 + 1;
        if (length != 0 && iVar9 == length) break;
        lVar8 = (long)iVar9;
        lVar6 = lVar6 + dataNumber[lVar8];
        std::__cxx11::string::erase((ulong)&line,0);
        iVar2 = std::__cxx11::string::find(cVar7,0x5d);
        std::__cxx11::string::erase((ulong)&line,(long)iVar2);
        iVar2 = std::__cxx11::string::find(cVar7,0xd);
        if (iVar2 != -1) {
          std::__cxx11::string::erase((ulong)&line,(long)iVar2);
        }
      }
      if (dataNumber[lVar8] != 0) {
        dVar10 = atof(line._M_dataplus._M_p);
        pmVar1 = pTeam[lVar8];
        pTeam[lVar8] = pmVar1 + 1;
        *pmVar1 = (float)dVar10;
      }
      lVar5 = lVar5 + 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"no such file");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&in);
  return;
}

Assistant:

void readData(string filename, long dataNumber[], mydataFmt *pTeam[], int length) {
    ifstream in(filename.data());
    string line;
    long temp = dataNumber[0];
    if (in) {
        int i = 0;
        int count = 0;
        int pos = 0;
        while (getline(in, line)) {
            try {
                if (i < temp) {
                    line.erase(0, 1);
                    pos = line.find(']');
                    line.erase(pos, 1);
                    pos = line.find('\r');
                    if (pos != -1) {
                        line.erase(pos, 1);
                    }
                    if (dataNumber[count] != 0) {
                        *(pTeam[count])++ = atof(line.data());
                    }
                } else {
                    count++;
                    if ((length != 0) && (count == length))
                        break;
                    temp += dataNumber[count];
                    line.erase(0, 1);
                    pos = line.find(']');
                    line.erase(pos, 1);
                    pos = line.find('\r');
                    if (pos != -1) {
                        line.erase(pos, 1);
                    }
                    if (dataNumber[count] != 0) {
                        *(pTeam[count])++ = atof(line.data());
                    }
                }
                i++;
            }
            catch (exception &e) {
                cout << " error " << i << endl;
                return;
            }
        }
    } else {
        cout << "no such file" << filename << endl;
    }
}